

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

cmListFileBacktrace * __thiscall
cmGeneratorTarget::GetBacktrace(cmListFileBacktrace *__return_storage_ptr__,cmGeneratorTarget *this)

{
  cmListFileBacktrace *pcVar1;
  
  pcVar1 = cmTarget::GetBacktrace(this->Target);
  cmListFileBacktrace::cmListFileBacktrace(__return_storage_ptr__,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

cmListFileBacktrace cmGeneratorTarget::GetBacktrace() const
{
  return this->Target->GetBacktrace();
}